

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O0

void __thiscall
Cgmres<Model>::init_u0_newton(Cgmres<Model> *this,double *u0,double *x0,double *p0,uint16_t n_loop)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  ushort in_R8W;
  uint16_t i;
  double mat [36];
  double vec [6];
  double lmd0 [4];
  ushort local_19a;
  double *in_stack_fffffffffffffe68;
  Cgmres<Model> *in_stack_fffffffffffffe70;
  double local_78 [6];
  double local_48 [4];
  ushort local_22;
  double *local_20;
  double *local_18;
  double *local_10;
  
  local_22 = in_R8W;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Model::dPhidx(local_48,in_RDX,in_RCX);
  for (local_19a = 0; local_19a < local_22; local_19a = local_19a + 1) {
    Model::dHdu(local_78,local_18,local_10,local_20,local_48);
    Model::ddHduu((double *)&stack0xfffffffffffffe68,local_18,local_10,local_20,local_48);
    linsolve(local_78,(double *)&stack0xfffffffffffffe68,6);
    sub(local_10,local_10,local_78,6);
  }
  init_u0(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  return;
}

Assistant:

void init_u0_newton(double* u0, const double* x0, const double* p0, const uint16_t n_loop) {
    double lmd0[dim_x], vec[dim_u], mat[dim_u * dim_u];

    Model::dPhidx(lmd0, x0, p0);

    // u0 = u0 - dHduu \ dHdu
    for (uint16_t i = 0; i < n_loop; i++) {
      Model::dHdu(vec, x0, u0, p0, lmd0);
      Model::ddHduu(mat, x0, u0, p0, lmd0);
      linsolve(vec, mat, dim_u);

      sub(u0, u0, vec, dim_u);
    }

    init_u0(u0);
  }